

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trainer.cpp
# Opt level: O0

void __thiscall
Trainer::Trainer<Kuhn::Game>::writeStrategyToBin(Trainer<Kuhn::Game> *this,int iteration)

{
  undefined4 uVar1;
  bool bVar2;
  byte bVar3;
  reference pvVar4;
  reference pcVar5;
  double *pdVar6;
  ostream *poVar7;
  undefined1 local_390 [8];
  binary_oarchive oa;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  ostream local_2f0 [8];
  ofstream ofs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  byte local_ae;
  allocator local_ad [20];
  byte local_99;
  string local_98;
  undefined1 local_78 [8];
  string path;
  int i;
  char c;
  const_iterator __end3;
  const_iterator __begin3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__range3;
  value_type *itr;
  const_iterator __end2;
  const_iterator __begin2;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>_>_>
  *__range2;
  int iteration_local;
  Trainer<Kuhn::Game> *this_local;
  
  __end2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>_>_>
           ::begin(&this->mNodeMap);
  itr = (value_type *)
        std::
        unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>_>_>
        ::end(&this->mNodeMap);
  while (bVar2 = std::__detail::operator!=
                           (&__end2.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>,_true>
                            ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>,_true>
                              *)&itr), bVar2) {
    pvVar4 = std::__detail::
             _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>,_false,_true>
             ::operator*(&__end2);
    __end3._M_current = (char *)std::__cxx11::string::begin();
    _i = (char *)std::__cxx11::string::end();
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)&i), bVar2) {
      pcVar5 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&__end3);
      path.field_2._M_local_buf[0xf] = *pcVar5;
      std::ostream::operator<<(&std::cout,(int)path.field_2._M_local_buf[0xf]);
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end3);
    }
    std::operator<<((ostream *)&std::cout,":");
    for (path.field_2._8_4_ = 0; uVar1 = path.field_2._8_4_, bVar3 = Node::actionNum(pvVar4->second)
        , (int)uVar1 < (int)(uint)bVar3; path.field_2._8_4_ = path.field_2._8_4_ + 1) {
      pdVar6 = Node::averageStrategy(pvVar4->second);
      poVar7 = (ostream *)std::ostream::operator<<(&std::cout,pdVar6[(int)path.field_2._8_4_]);
      std::operator<<(poVar7,",");
    }
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    std::__detail::
    _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>,_false,_true>
    ::operator++(&__end2);
  }
  local_99 = 0;
  local_ae = 0;
  if (iteration < 1) {
    std::allocator<char>::allocator();
    local_ae = 1;
    std::__cxx11::string::string((string *)local_78,"strategy",local_ad);
  }
  else {
    std::__cxx11::to_string(&local_98,iteration);
    local_99 = 1;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                   "strategy_",&local_98);
  }
  if ((local_ae & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)local_ad);
  }
  if ((local_99 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_98);
  }
  std::operator+(&local_f0,"_",this->mModeStr);
  std::operator+(&local_d0,&local_f0,".bin");
  std::__cxx11::string::operator+=((string *)local_78,(string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &oa.
                  super_binary_oarchive_impl<boost::archive::binary_oarchive,_char,_std::char_traits<char>_>
                  .field_0x58,&this->mFolderPath,"/");
  std::operator+(&local_310,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &oa.
                  super_binary_oarchive_impl<boost::archive::binary_oarchive,_char,_std::char_traits<char>_>
                  .field_0x58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
  std::ofstream::ofstream(local_2f0,&local_310,0x10);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string
            ((string *)
             &oa.
              super_binary_oarchive_impl<boost::archive::binary_oarchive,_char,_std::char_traits<char>_>
              .field_0x58);
  boost::archive::binary_oarchive::binary_oarchive((binary_oarchive *)local_390,local_2f0,0);
  boost::archive::detail::interface_oarchive<boost::archive::binary_oarchive>::operator<<
            ((interface_oarchive<boost::archive::binary_oarchive> *)local_390,&this->mNodeMap);
  std::ofstream::close();
  boost::archive::binary_oarchive::~binary_oarchive((binary_oarchive *)local_390);
  std::ofstream::~ofstream(local_2f0);
  std::__cxx11::string::~string((string *)local_78);
  return;
}

Assistant:

void Trainer<T>::writeStrategyToBin(const int iteration) const {
    for (auto &itr : mNodeMap) {
        for (char c : itr.first) {
            std::cout << int(c);
        }
        std::cout << ":";
        for (int i = 0; i < itr.second->actionNum(); ++i) {
            std::cout << itr.second->averageStrategy()[i] << ",";
        }
        std::cout << std::endl;
    }
    std::string path = iteration > 0 ? "strategy_" + std::to_string(iteration)
                                     : "strategy";
    path += "_" + mModeStr + ".bin";
    std::ofstream ofs(mFolderPath + "/" + path);
    boost::archive::binary_oarchive oa(ofs);
    oa << mNodeMap;
    ofs.close();
}